

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void * threadsafe_mem_leak_operator_new_debug(size_t size,char *file,size_t line)

{
  MemoryLeakDetector *file_00;
  TestMemoryAllocator *line_00;
  char *pcVar1;
  undefined8 uVar2;
  void *memory;
  MemLeakScopedMutex lock;
  bad_alloc *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 allocatNodesSeperately;
  size_t in_stack_ffffffffffffffc8;
  TestMemoryAllocator *in_stack_ffffffffffffffd0;
  MemoryLeakDetector *in_stack_ffffffffffffffd8;
  
  allocatNodesSeperately = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  MemLeakScopedMutex::MemLeakScopedMutex((MemLeakScopedMutex *)in_stack_ffffffffffffffa0);
  file_00 = MemoryLeakWarningPlugin::getGlobalDetector();
  line_00 = getCurrentNewAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                      (char *)file_00,(size_t)line_00,(bool)allocatNodesSeperately);
  if (pcVar1 == (char *)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffa0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  MemLeakScopedMutex::~MemLeakScopedMutex((MemLeakScopedMutex *)0x16d52e);
  return pcVar1;
}

Assistant:

UT_THROW(std::bad_alloc)
{
    MemLeakScopedMutex lock;
    void *memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewAllocator(), size, file, line);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}